

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::Cord::CopyToArraySlowPath(Cord *this,Nonnull<char_*> dst)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  ulong __n;
  string_view sVar5;
  string_view fragment;
  ChunkIterator __begin1;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  ChunkIterator local_c8;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("contents_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x433,"void absl::Cord::CopyToArraySlowPath(absl::Nonnull<char *>) const");
  }
  local_d8._M_len = 0;
  local_d8._M_str = (char *)0x0;
  bVar3 = GetFlatAux((this->contents_).data_.rep_.field_0.as_tree.rep,&local_d8);
  if (bVar3) {
    memcpy(dst,local_d8._M_str,local_d8._M_len);
  }
  else {
    local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
    local_c8.bytes_remaining_ = 0;
    local_c8.current_chunk_ = (string_view)ZEXT816(0);
    local_c8.btree_reader_.remaining_ = 0;
    local_c8.btree_reader_.navigator_.height_ = -1;
    bVar1 = (this->contents_).data_.rep_.field_0.data[0];
    tree = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
      if ((bVar1 & 1) != 0) {
        CopyToArraySlowPath();
LAB_00132203:
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x5fa,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
      local_c8.current_chunk_._M_str = (char *)((long)&(this->contents_).data_.rep_.field_0 + 1);
      local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
    }
    else {
      local_c8.bytes_remaining_ = tree->length;
      if (local_c8.bytes_remaining_ == 0) {
        return;
      }
      ChunkIterator::InitTree(&local_c8,tree);
    }
    if (local_c8.bytes_remaining_ != 0) {
      sVar5 = local_c8.current_chunk_;
      do {
        sVar2 = local_c8.bytes_remaining_;
        __n = sVar5._M_len;
        memcpy(dst,sVar5._M_str,__n);
        dst = dst + __n;
        uVar4 = sVar2 - __n;
        if (sVar2 < __n) goto LAB_00132203;
        local_c8.bytes_remaining_ = uVar4;
        if (uVar4 != 0) {
          if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
             (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
              (CordRepBtree *)0x0)) {
            if (__n == 0) {
              __assert_fail("!current_chunk_.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.h"
                            ,0x600,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
            }
            local_c8.current_chunk_ = (string_view)ZEXT816(0);
            sVar5 = (string_view)ZEXT816(0);
          }
          else {
            sVar5 = cord_internal::CordRepBtreeReader::Next(&local_c8.btree_reader_);
            local_c8.current_chunk_ = sVar5;
          }
        }
      } while (local_c8.bytes_remaining_ != 0);
    }
  }
  return;
}

Assistant:

void Cord::CopyToArraySlowPath(absl::Nonnull<char*> dst) const {
  assert(contents_.is_tree());
  absl::string_view fragment;
  if (GetFlatAux(contents_.tree(), &fragment)) {
    memcpy(dst, fragment.data(), fragment.size());
    return;
  }
  for (absl::string_view chunk : Chunks()) {
    memcpy(dst, chunk.data(), chunk.size());
    dst += chunk.size();
  }
}